

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O0

void satoko_rollback(satoko_t *s)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  void *__ptr;
  clause_conflict *pcVar5;
  watch_list *pwVar6;
  clause_conflict **cl_to_remove;
  uint n_learnts;
  uint n_originals;
  uint cref;
  uint i;
  satoko_t *s_local;
  
  uVar2 = vec_uint_size(s->originals);
  iVar3 = uVar2 - s->book_cl_orig;
  uVar2 = vec_uint_size(s->learnts);
  iVar4 = uVar2 - s->book_cl_lrnt;
  if (s->status != 1) {
    __assert_fail("s->status == SATOKO_OK",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver_api.c"
                  ,0x204,"void satoko_rollback(satoko_t *)");
  }
  uVar2 = solver_dlevel(s);
  if (uVar2 != 0) {
    __assert_fail("solver_dlevel(s) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver_api.c"
                  ,0x205,"void satoko_rollback(satoko_t *)");
  }
  if (s->book_vars == 0) {
    satoko_reset(s);
  }
  else {
    __ptr = malloc((ulong)(uint)(iVar3 + iVar4) << 3);
    for (n_originals = s->book_cl_orig; uVar2 = vec_uint_size(s->originals), n_originals < uVar2;
        n_originals = n_originals + 1) {
      uVar2 = vec_uint_at(s->originals,n_originals);
      pcVar5 = clause_fetch(s,uVar2);
      *(clause_conflict **)((long)__ptr + (ulong)n_originals * 8) = pcVar5;
    }
    for (n_originals = s->book_cl_lrnt; uVar2 = vec_uint_size(s->learnts), n_originals < uVar2;
        n_originals = n_originals + 1) {
      uVar2 = vec_uint_at(s->learnts,n_originals);
      pcVar5 = clause_fetch(s,uVar2);
      *(clause_conflict **)((long)__ptr + (ulong)(iVar3 + n_originals) * 8) = pcVar5;
    }
    for (n_originals = 0; n_originals < (uint)(iVar3 + iVar4); n_originals = n_originals + 1) {
      uVar2 = cdb_cref(s->all_clauses,*(uint **)((long)__ptr + (ulong)n_originals * 8));
      clause_unwatch(s,uVar2);
      puVar1 = *(uint **)((long)__ptr + (ulong)n_originals * 8);
      *puVar1 = *puVar1 & 0xfffffffd | 2;
    }
    free(__ptr);
    vec_uint_shrink(s->originals,s->book_cl_orig);
    vec_uint_shrink(s->learnts,s->book_cl_lrnt);
    for (n_originals = s->book_vars; uVar2 = vec_char_size(s->assigns), n_originals < uVar2 << 1;
        n_originals = n_originals + 1) {
      pwVar6 = vec_wl_at(s->watches,n_originals);
      pwVar6->size = 0;
      pwVar6 = vec_wl_at(s->watches,n_originals);
      pwVar6->n_bin = 0;
    }
    s->watches->size = s->book_vars;
    vec_sdbl_shrink(s->activity,s->book_vars);
    vec_uint_shrink(s->levels,s->book_vars);
    vec_uint_shrink(s->reasons,s->book_vars);
    vec_uint_shrink(s->stamps,s->book_vars);
    vec_char_shrink(s->assigns,s->book_vars);
    vec_char_shrink(s->seen,s->book_vars);
    vec_char_shrink(s->polarity,s->book_vars);
    solver_rebuild_order(s);
    solver_cancel_until(s,0);
    vec_uint_shrink(s->trail,s->book_trail);
    if (s->book_cdb != 0) {
      s->all_clauses->size = s->book_cdb;
    }
    s->book_cl_orig = 0;
    s->book_cl_lrnt = 0;
    s->book_vars = 0;
    s->book_trail = 0;
  }
  return;
}

Assistant:

void satoko_rollback(satoko_t *s)
{
    unsigned i, cref;
    unsigned n_originals = vec_uint_size(s->originals) - s->book_cl_orig;
    unsigned n_learnts = vec_uint_size(s->learnts) - s->book_cl_lrnt;
    struct clause **cl_to_remove;

    // printf("[Satoko] rollback.\n");
    assert(s->status == SATOKO_OK);
    assert(solver_dlevel(s) == 0);
    if (!s->book_vars) {
        satoko_reset(s);
        return;
    }
    cl_to_remove = satoko_alloc(struct clause *, n_originals + n_learnts);
    /* Mark clauses */
    vec_uint_foreach_start(s->originals, cref, i, s->book_cl_orig)
        cl_to_remove[i] = clause_fetch(s, cref);
    vec_uint_foreach_start(s->learnts, cref, i, s->book_cl_lrnt)
        cl_to_remove[n_originals + i] = clause_fetch(s, cref);
    for (i = 0; i < n_originals + n_learnts; i++) {
        clause_unwatch(s, cdb_cref(s->all_clauses, (unsigned *)cl_to_remove[i]));
        cl_to_remove[i]->f_mark = 1;
    }
    satoko_free(cl_to_remove);
    vec_uint_shrink(s->originals, s->book_cl_orig);
    vec_uint_shrink(s->learnts, s->book_cl_lrnt);
    /* Shrink variable related vectors */
    for (i = s->book_vars; i < 2 * vec_char_size(s->assigns); i++) {
        vec_wl_at(s->watches, i)->size = 0;
        vec_wl_at(s->watches, i)->n_bin = 0;
    }
    // s->i_qhead = s->book_qhead;
    s->watches->size = s->book_vars;
    vec_act_shrink(s->activity, s->book_vars);
    vec_uint_shrink(s->levels, s->book_vars);
    vec_uint_shrink(s->reasons, s->book_vars);
    vec_uint_shrink(s->stamps, s->book_vars);
    vec_char_shrink(s->assigns, s->book_vars);
    vec_char_shrink(s->seen, s->book_vars);
    vec_char_shrink(s->polarity, s->book_vars);
    solver_rebuild_order(s);
    /* Rewind solver and cancel level 0 assignments to the trail */
    solver_cancel_until(s, 0);
    vec_uint_shrink(s->trail, s->book_trail);
    if (s->book_cdb)
        s->all_clauses->size = s->book_cdb;
    s->book_cl_orig = 0;
    s->book_cl_lrnt = 0;
    s->book_vars = 0;
    s->book_trail = 0;
    // s->book_qhead = 0;
}